

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_vectors.h
# Opt level: O0

uint32_t WhichDots16(char *x)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  __m128i src;
  __m128i dots;
  char *x_local;
  
  auVar1 = vpinsrb_avx(ZEXT116(0x2e),0x2e,1);
  auVar1 = vpinsrb_avx(auVar1,0x2e,2);
  auVar1 = vpinsrb_avx(auVar1,0x2e,3);
  auVar1 = vpinsrb_avx(auVar1,0x2e,4);
  auVar1 = vpinsrb_avx(auVar1,0x2e,5);
  auVar1 = vpinsrb_avx(auVar1,0x2e,6);
  auVar1 = vpinsrb_avx(auVar1,0x2e,7);
  auVar1 = vpinsrb_avx(auVar1,0x2e,8);
  auVar1 = vpinsrb_avx(auVar1,0x2e,9);
  auVar1 = vpinsrb_avx(auVar1,0x2e,10);
  auVar1 = vpinsrb_avx(auVar1,0x2e,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x2e,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x2e,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x2e,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x2e,0xf);
  uVar2 = vpcmpeqb_avx512vl(*(undefined1 (*) [16])x,auVar1);
  return (uint32_t)uVar2;
}

Assistant:

inline uint32_t WhichDots16(const char *x) {
    const __m128i dots = _mm_set1_epi8('.');
    const __m128i src = _mm_loadu_si128((const __m128i *) x);
#if(defined __AVX512VL__ && defined __AVX512BW__)
    return ((uint32_t) _mm_cmpeq_epi8_mask(src, dots));
#else
    return ((uint32_t) _mm_movemask_epi8(_mm_cmpeq_epi8(src, dots)));
#endif
}